

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_16x4_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint *in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar2 [16];
  __m128i *extraout_XMM0_Qb;
  __m128i row;
  __m128i l16;
  int i;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i top1;
  __m128i top0;
  __m128i zero;
  __m128i t;
  __m128i l;
  __m128i *in_stack_fffffffffffffde0;
  __m128i *in_stack_fffffffffffffdf8;
  int local_1fc;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_160;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  
  uVar1 = *in_RCX;
  local_1e8 = 0x8000800080008000;
  uStack_1e0 = 0x8000800080008000;
  local_160 = in_RDI;
  for (local_1fc = 0; local_1fc < 4; local_1fc = local_1fc + 1) {
    auVar2._8_8_ = uStack_1e0;
    auVar2._0_8_ = local_1e8;
    auVar2 = pshufb(ZEXT416(uVar1),auVar2);
    paeth_16x1_pred(in_stack_fffffffffffffdf8,auVar2._8_8_,auVar2._0_8_,in_stack_fffffffffffffde0);
    *local_160 = extraout_XMM0_Qa;
    local_160[1] = extraout_XMM0_Qb;
    local_160 = (undefined8 *)(in_RSI + (long)local_160);
    local_e8 = (short)local_1e8;
    sStack_e6 = (short)((ulong)local_1e8 >> 0x10);
    sStack_e4 = (short)((ulong)local_1e8 >> 0x20);
    sStack_e2 = (short)((ulong)local_1e8 >> 0x30);
    sStack_e0 = (short)uStack_1e0;
    sStack_de = (short)((ulong)uStack_1e0 >> 0x10);
    sStack_dc = (short)((ulong)uStack_1e0 >> 0x20);
    sStack_da = (short)((ulong)uStack_1e0 >> 0x30);
    local_1e8 = CONCAT26(sStack_e2 + 1,CONCAT24(sStack_e4 + 1,CONCAT22(sStack_e6 + 1,local_e8 + 1)))
    ;
    uStack_1e0 = CONCAT26(sStack_da + 1,
                          CONCAT24(sStack_dc + 1,CONCAT22(sStack_de + 1,sStack_e0 + 1)));
    in_stack_fffffffffffffde0 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x4_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_cvtsi32_si128(((const int *)left)[0]);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  for (int i = 0; i < 4; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}